

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Graph<Node> * __thiscall
Graph<Node>::minSpanningTree(Graph<Node> *__return_storage_ptr__,Graph<Node> *this,int node)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Edge *pEVar5;
  Edge *__last;
  int local_9c;
  int local_98;
  int dest_1;
  int source_1;
  Edge currEdge_1;
  int i_2;
  int local_7c;
  int dest;
  int source;
  Edge currEdge;
  int i_1;
  vector<Edge> ccEdges;
  int local_50;
  int currCC;
  int i;
  undefined1 local_40 [8];
  vector<int> depth;
  vector<int> father;
  int node_local;
  Graph<Node> *this_local;
  Graph<Node> *MST;
  
  father._capacity = node;
  vector<int>::vector((vector<int> *)&depth._size,this->_nodeCnt);
  vector<int>::vector((vector<int> *)local_40,this->_nodeCnt);
  for (local_50 = 0; iVar3 = local_50, local_50 < this->_nodeCnt; local_50 = local_50 + 1) {
    piVar4 = vector<int>::operator[]((vector<int> *)&depth._size,&local_50);
    *piVar4 = iVar3;
    piVar4 = vector<int>::operator[]((vector<int> *)local_40,&local_50);
    *piVar4 = 1;
  }
  piVar4 = vector<int>::operator[](&this->inCC,&father._capacity);
  iVar3 = *piVar4;
  vector<Edge>::vector((vector<Edge> *)&currEdge._cost);
  for (currEdge._nodeD = 0; iVar2 = currEdge._nodeD, iVar1 = vector<Edge>::size(&this->edges),
      iVar2 < iVar1; currEdge._nodeD = currEdge._nodeD + 1) {
    getEdge((Graph<Node> *)&dest,&this->_nodeCnt);
    local_7c = Edge::getSource((Edge *)&dest);
    Edge::getDest((Edge *)&dest);
    piVar4 = vector<int>::operator[](&this->inCC,&local_7c);
    if (*piVar4 == iVar3) {
      vector<Edge>::push_back((vector<Edge> *)&currEdge._cost,(Edge *)&dest);
    }
    Edge::~Edge((Edge *)&dest);
  }
  pEVar5 = vector<Edge>::begin((vector<Edge> *)&currEdge._cost);
  __last = vector<Edge>::end((vector<Edge> *)&currEdge._cost);
  std::sort<Edge*,bool(*)(Edge_const&,Edge_const&)>(pEVar5,__last,byCostCmp);
  currEdge_1._cost._3_1_ = 0;
  Graph(__return_storage_ptr__,this->_nodeCnt);
  for (currEdge_1._nodeD = 0; iVar3 = currEdge_1._nodeD,
      iVar2 = vector<Edge>::size((vector<Edge> *)&currEdge._cost), iVar3 < iVar2;
      currEdge_1._nodeD = currEdge_1._nodeD + 1) {
    pEVar5 = vector<Edge>::operator[]((vector<Edge> *)&currEdge._cost,&currEdge_1._nodeD);
    Edge::Edge((Edge *)&dest_1,pEVar5);
    local_98 = Edge::getSource((Edge *)&dest_1);
    local_9c = Edge::getDest((Edge *)&dest_1);
    iVar3 = findRt(this,(vector<int> *)&depth._size,&local_98);
    iVar2 = findRt(this,(vector<int> *)&depth._size,&local_9c);
    if (iVar3 != iVar2) {
      mergeDSU(this,(vector<int> *)&depth._size,(vector<int> *)local_40,local_98,local_9c);
      addEdge(__return_storage_ptr__,(Edge *)&dest_1);
    }
    Edge::~Edge((Edge *)&dest_1);
  }
  currEdge_1._cost._3_1_ = 1;
  vector<Edge>::~vector((vector<Edge> *)&currEdge._cost);
  vector<int>::~vector((vector<int> *)local_40);
  vector<int>::~vector((vector<int> *)&depth._size);
  return __return_storage_ptr__;
}

Assistant:

Graph minSpanningTree(int node) {
        vector <int> father(_nodeCnt);
        vector <int> depth(_nodeCnt);

        for (int i = 0; i < _nodeCnt; ++i) {
            father[i] = i;
            depth[i] = 1;
        }

        int currCC = inCC[node];

        vector <Edge> ccEdges;
        for (int i = 0; i < edges.size(); ++i) {
            Edge currEdge = getEdge(i);
            int source = currEdge.getSource();
            int dest = currEdge.getDest();

            if (inCC[source] == currCC) { //destination cannot be outside CC (the two nodes are connected)
                ccEdges.push_back(currEdge);
            }
        }

        std::sort(ccEdges.begin(), ccEdges.end(), byCostCmp);

//        ccEdges.mergeSort(0, ccEdges.size() - 1, [](Edge a, Edge b) {
//            return a.getCost() < b.getCost();
//        });

        Graph MST(_nodeCnt);

        for (int i = 0; i < ccEdges.size(); ++i) {
            Edge currEdge = ccEdges[i];
            int source = currEdge.getSource();
            int dest = currEdge.getDest();

            if (findRt(father, source) != findRt(father, dest)) {
                mergeDSU(father, depth, source, dest);
                MST.addEdge(currEdge);
            }
        }

        return MST;
    }